

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FASTCOVER_hashPtrToIndex(void *p,U32 f,uint d)

{
  long lVar1;
  
  lVar1 = -0x30e44323485a9b9d;
  if (d == 6) {
    if (0x40 < f) {
      __assert_fail("h <= 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x471c,"size_t ZSTD_hash6(U64, U32, U64)");
    }
    lVar1 = -0x30e4432340650000;
  }
  else if (0x40 < f) {
    __assert_fail("h <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4726,"size_t ZSTD_hash8(U64, U32, U64)");
  }
  return (ulong)(lVar1 * *p) >> (-(char)f & 0x3fU);
}

Assistant:

static size_t FASTCOVER_hashPtrToIndex(const void* p, U32 f, unsigned d) {
  if (d == 6) {
    return ZSTD_hash6Ptr(p, f);
  }
  return ZSTD_hash8Ptr(p, f);
}